

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boolean.cpp
# Opt level: O0

void __thiscall Boolean_ParseTrue_Test::Boolean_ParseTrue_Test(Boolean_ParseTrue_Test *this)

{
  Boolean_ParseTrue_Test *this_local;
  
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__Boolean_ParseTrue_Test_00228c38;
  return;
}

Assistant:

TEST(Boolean, ParseTrue) {
    std::istringstream input("true = true");
    events_aggregator_t handler;

    loltoml::parse(input, handler);

    std::vector<sax_event_t> expected_events = {
        {sax_event_t::start_document},
        {sax_event_t::key, "true"},
        {sax_event_t::boolean, true},
        {sax_event_t::finish_document}
    };

    EXPECT_EQ(expected_events, handler.events);
}